

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int is_ref_frame_used_by_compound_ref(int ref_frame,int skip_ref_frame_mask)

{
  int r;
  ulong uVar1;
  
  uVar1 = 8;
  while ((uVar1 != 0x1d &&
         ((((uint)skip_ref_frame_mask >> ((uint)uVar1 & 0x1f) & 1) != 0 ||
          (((char)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [uVar1 * 2 + 0x10] != ref_frame &&
           ((char)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [uVar1 * 2 + 0x11] != ref_frame))))))) {
    uVar1 = uVar1 + 1;
  }
  return (int)(uVar1 < 0x1d);
}

Assistant:

static inline int is_ref_frame_used_by_compound_ref(int ref_frame,
                                                    int skip_ref_frame_mask) {
  for (int r = ALTREF_FRAME + 1; r < MODE_CTX_REF_FRAMES; ++r) {
    if (!(skip_ref_frame_mask & (1 << r))) {
      const MV_REFERENCE_FRAME *rf = ref_frame_map[r - REF_FRAMES];
      if (rf[0] == ref_frame || rf[1] == ref_frame) {
        return 1;
      }
    }
  }
  return 0;
}